

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O0

ssize_t __thiscall
ezc3d::ParametersNS::Parameters::write(Parameters *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  __mbstate_t _Var2;
  bool bVar3;
  size_t sVar4;
  streamoff sVar5;
  int nBlocksToNext;
  streampos currentPos;
  Group *currentGroup;
  size_t i;
  int processorType;
  int blankValue;
  streampos pos;
  int checksum;
  Parameters *p;
  WRITE_FORMAT *in_stack_00000ed8;
  Header *in_stack_00000ee0;
  Parameters *in_stack_00000ee8;
  Group *in_stack_fffffffffffffec8;
  fstream *in_stack_fffffffffffffee0;
  int local_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  int iStack_a0;
  anon_union_4_2_91654ee9_for___value aStack_9c;
  fpos<__mbstate_t> local_98;
  fpos<__mbstate_t> local_88;
  Group *local_70;
  ulong local_68;
  undefined4 local_60;
  undefined4 local_5c;
  fpos<__mbstate_t> local_58;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffbc;
  Parameters *in_stack_ffffffffffffffc0;
  
  prepareCopyForWriting(in_stack_00000ee8,in_stack_00000ee0,in_stack_00000ed8);
  std::ostream::write((char *)((long)__buf + 0x10),(long)this);
  uVar6 = 0x50;
  std::ostream::write((char *)((long)__buf + 0x10),(long)&stack0xffffffffffffffb8);
  local_58 = (fpos<__mbstate_t>)std::istream::tellg();
  local_5c = 0;
  std::ostream::write((char *)((long)__buf + 0x10),(long)&local_5c);
  local_60 = 0x54;
  std::ostream::write((char *)((long)__buf + 0x10),(long)&local_60);
  for (local_68 = 0; uVar1 = local_68, sVar4 = nbGroups((Parameters *)0x17161d), uVar1 < sVar4;
      local_68 = local_68 + 1) {
    local_70 = group(in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,uVar6));
    bVar3 = GroupNS::Group::isEmpty(in_stack_fffffffffffffec8);
    if (!bVar3) {
      GroupNS::Group::write(local_70,(int)__buf,(void *)(ulong)~(uint)local_68,__n);
    }
  }
  ezc3d::c3d::moveCursorToANewBlock(in_stack_fffffffffffffee0);
  local_88 = (fpos<__mbstate_t>)std::istream::tellg();
  local_98 = (fpos<__mbstate_t>)std::istream::tellg();
  _Var2 = local_58._M_state;
  sVar5 = local_58._M_off;
  local_a8 = (undefined4)local_58._M_off;
  uStack_a4 = local_58._M_off._4_4_;
  iStack_a0 = local_58._M_state.__count;
  aStack_9c.__wch = local_58._M_state.__value.__wch;
  local_88 = local_98;
  std::istream::seekg(__buf,sVar5,_Var2);
  sVar5 = std::fpos<__mbstate_t>::operator-(&local_88,&local_58);
  local_ac = (int)sVar5 + -2;
  if (local_ac < 0) {
    local_ac = (int)sVar5 + 0x1fd;
  }
  local_ac = local_ac >> 9;
  sVar5 = std::fpos<__mbstate_t>::operator-(&local_88,&local_58);
  if (0 < ((int)sVar5 + -2) % 0x200) {
    local_ac = local_ac + 1;
  }
  std::ostream::write((char *)((long)__buf + 0x10),(long)&local_ac);
  std::istream::seekg(__buf,local_88._M_off,local_88._M_state);
  return (ssize_t)this;
}

Assistant:

ezc3d::ParametersNS::Parameters ezc3d::ParametersNS::Parameters::write(
    std::fstream &f, ezc3d::DataStartInfo &dataStartPositionToFill,
    const ezc3d::Header &header, const ezc3d::WRITE_FORMAT &format) const {
  ezc3d::ParametersNS::Parameters p(prepareCopyForWriting(header, format));

  // Write the header of parameters
  f.write(reinterpret_cast<const char *>(&p._parametersStart), ezc3d::BYTE);
  int checksum(0x50);
  f.write(reinterpret_cast<const char *>(&checksum), ezc3d::BYTE);
  // Leave a blank space which will be later fill
  // (number of block can't be known before writing them)
  std::streampos pos(f.tellg()); // remember where to input this value later
  int blankValue(0);
  f.write(reinterpret_cast<const char *>(&blankValue), ezc3d::BYTE);
  int processorType = PROCESSOR_TYPE::INTEL;
  f.write(reinterpret_cast<const char *>(&processorType), ezc3d::BYTE);

  // Write each groups
  for (size_t i = 0; i < p.nbGroups(); ++i) {
    const ezc3d::ParametersNS::GroupNS::Group &currentGroup(p.group(i));
    if (!currentGroup.isEmpty())
      currentGroup.write(f, -static_cast<int>(i + 1), dataStartPositionToFill);
  }

  // Move the cursor to a beginning of a block
  ezc3d::c3d::moveCursorToANewBlock(f);
  // Go back at the left blank space (next parameter position in the last
  // parameter) and write the current position
  std::streampos currentPos(f.tellg());
  currentPos = f.tellg();
  f.seekg(pos);
  int nBlocksToNext = int(currentPos - pos - 2) / 512;
  if (int(currentPos - pos - 2) % 512 > 0)
    ++nBlocksToNext;
  f.write(reinterpret_cast<const char *>(&nBlocksToNext), ezc3d::BYTE);

  // Go back to where to start writing the data
  f.seekg(currentPos);

  return p;
}